

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotCreateUpdateForm.cpp
# Opt level: O3

void __thiscall SlotCreateUpdateForm::clean(SlotCreateUpdateForm *this)

{
  _Base_ptr *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Room *pRVar5;
  DateTime *sTime;
  DateTime *eTime;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Room *pRVar8;
  string local_50;
  
  if ((_Rb_tree_header *)
      Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = true;
    p_Var6 = Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (bVar2) {
        this_00 = &p_Var6[1]._M_parent;
        pRVar5 = Slot::getRoom((Slot *)this_00);
        iVar3 = Room::getRoomNumber(pRVar5);
        iVar4 = Room::getRoomNumber(&this->room);
        bVar2 = true;
        if (iVar3 == iVar4) {
          sTime = Slot::getStartTime((Slot *)this_00);
          eTime = Slot::getEndTime((Slot *)this_00);
          bVar1 = clash(this,sTime,eTime);
          if (bVar1) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,
                       "Some other Professor\'s slot is clashing with yours, please try again!","");
            Form::addError((Form *)this,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            goto LAB_0010a9ae;
          }
        }
      }
      else {
LAB_0010a9ae:
        bVar2 = false;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 !=
             &Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header);
  }
  pRVar5 = &this->room;
  iVar3 = Room::getStrength(pRVar5);
  iVar4 = Room::getRoomNumber(pRVar5);
  p_Var7 = &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (iVar4 <= (int)p_Var6[1]._M_color) {
      p_Var7 = p_Var6;
    }
    p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar4];
  } while (p_Var6 != (_Base_ptr)0x0);
  pRVar8 = (Room *)0x0;
  if ((int)p_Var7[1]._M_color <= iVar4) {
    pRVar8 = (Room *)&p_Var7[1]._M_parent;
  }
  iVar4 = Room::getStrength(pRVar8);
  if (iVar4 < iVar3) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Strength Exceeded","");
    Form::addError((Form *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  bVar2 = Room::hasAudio(pRVar5);
  if (bVar2) {
    iVar3 = Room::getRoomNumber(pRVar5);
    p_Var7 = &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (iVar3 <= (int)p_Var6[1]._M_color) {
        p_Var7 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar3];
    } while (p_Var6 != (_Base_ptr)0x0);
    pRVar8 = (Room *)0x0;
    if ((int)p_Var7[1]._M_color <= iVar3) {
      pRVar8 = (Room *)&p_Var7[1]._M_parent;
    }
    bVar2 = Room::hasAudio(pRVar8);
    if (!bVar2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Audio not available","");
      Form::addError((Form *)this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  bVar2 = Room::hasVideo(pRVar5);
  if (bVar2) {
    iVar3 = Room::getRoomNumber(pRVar5);
    p_Var7 = &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (iVar3 <= (int)p_Var6[1]._M_color) {
        p_Var7 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar3];
    } while (p_Var6 != (_Base_ptr)0x0);
    pRVar5 = (Room *)0x0;
    if ((int)p_Var7[1]._M_color <= iVar3) {
      pRVar5 = (Room *)&p_Var7[1]._M_parent;
    }
    bVar2 = Room::hasVideo(pRVar5);
    if (!bVar2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Video not available","");
      Form::addError((Form *)this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void SlotCreateUpdateForm::clean() {
    bool roomFlag = true;
//    for (auto &i : Slot::all()) {
//        if (!(roomFlag &&
//              room.getStrength() <= i.second.getRoom().getStrength() &&
//              ((room.hasAudio() && i.second.getRoom().hasAudio()) || !room.hasAudio()) &&
//              ((room.hasVideo() && i.second.getRoom().hasVideo()) || !room.hasVideo()) &&
//              (i.second.getStartTime() >= endTime || i.second.getEndTime() <= startTime))) {
//            roomFlag = false;
//        }
//    }

    for(auto &i: Slot::all()) {
        if (roomFlag && i.second.getRoom().getRoomNumber() == room.getRoomNumber() &&
            clash(i.second.getStartTime(), i.second.getEndTime())) {
            roomFlag = false;
            addError("Some other Professor's slot is clashing with yours, please try again!");
        }
    }
    //if (!roomFlag) addError("Error: The following may be occuring");    //TODO
    if(room.getStrength()>Room::findById(room.getRoomNumber())->getStrength())
    {
        roomFlag = false;
        addError("Strength Exceeded");
    }
    if(room.hasAudio() && !Room::findById(room.getRoomNumber())->hasAudio())
    {
        roomFlag = false;
        addError("Audio not available");
    }
    if(room.hasVideo() && !Room::findById(room.getRoomNumber())->hasVideo())
    {
        roomFlag = false;
        addError("Video not available");
    }
    int length = sizeof(reason) / sizeof(char);
    if (length > 2048) addError("Reason size is limited to 2048 characters\n");
}